

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocale.h
# Opt level: O1

void __thiscall cmLocaleRAII::~cmLocaleRAII(cmLocaleRAII *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  setlocale(0,(this->OldLocale)._M_dataplus._M_p);
  pcVar1 = (this->OldLocale)._M_dataplus._M_p;
  paVar2 = &(this->OldLocale).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~cmLocaleRAII() { setlocale(LC_CTYPE, this->OldLocale.c_str()); }